

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::readEditFaceData(PtexReader *this)

{
  pointer pFVar1;
  ushort uVar2;
  int size;
  int alphachan;
  pointer pFVar3;
  uint8_t *puVar4;
  pointer pFVar5;
  bool bVar6;
  long lVar7;
  EditFaceDataHeader efdh;
  FaceEdit local_38;
  
  efdh.faceinfo.res.ulog2 = '\0';
  efdh.faceinfo.res.vlog2 = '\0';
  efdh.faceinfo.adjedges = '\0';
  efdh.faceinfo.flags = '\0';
  efdh.faceinfo.adjfaces[0] = -1;
  efdh.faceinfo.adjfaces[1] = -1;
  efdh.faceinfo.adjfaces[2] = -1;
  efdh.faceinfo.adjfaces[3] = -1;
  efdh.fdh.data = 0;
  bVar6 = readBlock(this,&efdh,0x1c,true);
  if (bVar6) {
    lVar7 = (long)(int)efdh.faceid;
    if ((-1 < lVar7) && (efdh.faceid < (this->_header).nfaces)) {
      pFVar3 = (this->_faceinfo).
               super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar1 = pFVar3 + lVar7;
      (pFVar1->res).ulog2 = (char)efdh.faceinfo.res;
      (pFVar1->res).vlog2 = (char)((ushort)efdh.faceinfo.res >> 8);
      pFVar1->adjedges = efdh.faceinfo.adjedges;
      pFVar1->flags = efdh.faceinfo.flags;
      pFVar1->adjfaces[0] = efdh.faceinfo.adjfaces[0];
      *(ulong *)(pFVar1->adjfaces + 1) =
           CONCAT44(efdh.faceinfo.adjfaces[2],efdh.faceinfo.adjfaces[1]);
      pFVar3[lVar7].adjfaces[3] = efdh.faceinfo.adjfaces[3];
      pFVar3[lVar7].flags = pFVar3[lVar7].flags | 2;
      size = this->_pixelsize;
      puVar4 = this->_constdata;
      bVar6 = readBlock(this,puVar4 + (int)(size * efdh.faceid),size,true);
      if (bVar6) {
        if (this->_premultiply == true) {
          alphachan = (this->_header).alphachan;
          uVar2 = (this->_header).nchannels;
          if (alphachan < (int)(uint)uVar2 && -1 < alphachan) {
            PtexUtils::multalpha
                      (puVar4 + (int)(size * efdh.faceid),1,(this->_header).datatype,(uint)uVar2,
                       alphachan);
          }
        }
        if ((pFVar3[lVar7].flags & 1) == 0) {
          local_38.pos = 0;
          local_38.faceid = 0;
          local_38.fdh.data = 0;
          std::
          vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
          ::emplace_back<Ptex::v2_2::PtexReader::FaceEdit>(&this->_faceedits,&local_38);
          pFVar5 = (this->_faceedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pFVar5[-1].pos = this->_pos;
          pFVar5[-1].faceid = efdh.faceid;
          pFVar5[-1].fdh.data = efdh.fdh.data;
        }
      }
    }
  }
  return;
}

Assistant:

void PtexReader::readEditFaceData()
{
    // read header
    EditFaceDataHeader efdh;
    if (!readBlock(&efdh, EditFaceDataHeaderSize)) return;

    // update face info
    int faceid = efdh.faceid;
    if (faceid < 0 || size_t(faceid) >= _header.nfaces) return;
    FaceInfo& f = _faceinfo[faceid];
    f = efdh.faceinfo;
    f.flags |= FaceInfo::flag_hasedits;

    // read const value now
    uint8_t* constdata = _constdata + _pixelsize * faceid;
    if (!readBlock(constdata, _pixelsize)) return;
    if (_premultiply && _header.hasAlpha())
        PtexUtils::multalpha(constdata, 1, datatype(),
                             _header.nchannels, _header.alphachan);

    // update header info for remaining data
    if (!f.isConstant()) {
        _faceedits.push_back(FaceEdit());
        FaceEdit& e = _faceedits.back();
        e.pos = tell();
        e.faceid = faceid;
        e.fdh = efdh.fdh;
    }
}